

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_build_lights.cxx
# Opt level: O3

void __thiscall
xray_re::xr_build_lights::read_lights
          (xr_build_lights *this,xr_reader *r,uint32_t id,r_light_vec *lights,bool cs)

{
  pointer *ppprVar1;
  ulong uVar2;
  iterator __position;
  uint16_t *puVar3;
  float *pfVar4;
  uint32_t *puVar5;
  xr_reader *this_00;
  uint32_t uVar6;
  xr_reader *pxVar7;
  ulong __n;
  long lVar8;
  ulong uVar9;
  r_light *light;
  xr_reader *s;
  r_light *local_48;
  xr_reader *local_40;
  xr_reader *local_38;
  
  pxVar7 = xr_reader::open_chunk(r,id);
  if (pxVar7 != (xr_reader *)0x0) {
    local_40 = pxVar7;
    local_38 = r;
    if (pxVar7->m_end < pxVar7->m_data) {
      __assert_fail("m_data <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                    ,0x7a,"size_t xray_re::xr_reader::size() const");
    }
    uVar9 = (long)pxVar7->m_end - (long)pxVar7->m_data;
    uVar2 = (ulong)cs * 4 + 100;
    __n = uVar9 / uVar2;
    std::vector<xray_re::r_light_*,_std::allocator<xray_re::r_light_*>_>::reserve(lights,__n);
    this_00 = local_38;
    if (uVar2 <= uVar9) {
      do {
        local_48 = (r_light *)operator_new(0x68);
        __position._M_current =
             (lights->super__Vector_base<xray_re::r_light_*,_std::allocator<xray_re::r_light_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (lights->super__Vector_base<xray_re::r_light_*,_std::allocator<xray_re::r_light_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<xray_re::r_light*,std::allocator<xray_re::r_light*>>::
          _M_realloc_insert<xray_re::r_light*const&>
                    ((vector<xray_re::r_light*,std::allocator<xray_re::r_light*>> *)lights,
                     __position,&local_48);
        }
        else {
          *__position._M_current = local_48;
          ppprVar1 = &(lights->
                      super__Vector_base<xray_re::r_light_*,_std::allocator<xray_re::r_light_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          *ppprVar1 = *ppprVar1 + 1;
        }
        puVar3 = (pxVar7->field_2).m_p_u16;
        (pxVar7->field_2).m_p = (uint8_t *)(puVar3 + 1);
        local_48->type = *puVar3;
        puVar3 = (pxVar7->field_2).m_p_u16;
        (pxVar7->field_2).m_p = (uint8_t *)(puVar3 + 1);
        local_48->level = *puVar3;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        (local_48->diffuse).field_0.field_0.x = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        (local_48->diffuse).field_0.field_0.y = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        (local_48->diffuse).field_0.field_0.z = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        (local_48->position).field_0.field_0.x = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        (local_48->position).field_0.field_0.y = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        (local_48->position).field_0.field_0.z = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        (local_48->direction).field_0.field_0.x = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        (local_48->direction).field_0.field_0.y = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        (local_48->direction).field_0.field_0.z = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        local_48->range = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        local_48->range2 = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        local_48->attenuation0 = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        local_48->attenuation1 = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        local_48->attenuation2 = *pfVar4;
        pfVar4 = (float *)(pxVar7->field_2).m_p_u32;
        (pxVar7->field_2).m_p = (uint8_t *)(pfVar4 + 1);
        local_48->energy = *pfVar4;
        lVar8 = 0;
        do {
          puVar5 = (local_40->field_2).m_p_u32;
          (local_40->field_2).m_p = (uint8_t *)(puVar5 + 1);
          *(uint32_t *)((long)&local_48->tri[0].field_0 + lVar8) = *puVar5;
          puVar5 = (local_40->field_2).m_p_u32;
          (local_40->field_2).m_p = (uint8_t *)(puVar5 + 1);
          *(uint32_t *)((long)&local_48->tri[0].field_0 + lVar8 + 4) = *puVar5;
          puVar5 = (local_40->field_2).m_p_u32;
          (local_40->field_2).m_p = (uint8_t *)(puVar5 + 1);
          *(uint32_t *)((long)&local_48->tri[0].field_0 + lVar8 + 8) = *puVar5;
          lVar8 = lVar8 + 0xc;
        } while (lVar8 != 0x24);
        uVar6 = 0;
        if (cs) {
          puVar5 = (local_40->field_2).m_p_u32;
          (local_40->field_2).m_p = (uint8_t *)(puVar5 + 1);
          uVar6 = *puVar5;
        }
        local_48->unknown = uVar6;
        __n = __n - 1;
        pxVar7 = local_40;
      } while (__n != 0);
    }
    xr_reader::close_chunk(this_00,&local_40);
  }
  return;
}

Assistant:

void xr_build_lights::read_lights(xr_reader& r, uint32_t id, r_light_vec& lights, bool cs)
{
	if (xr_reader* s = r.open_chunk(id)) {
		size_t n = s->size() / (cs ? R_LIGHT_SIZE_CS : R_LIGHT_SIZE_SOC);
		lights.reserve(n);
		for (; n > 0; --n) {
			r_light* light = new r_light;
			lights.push_back(light);
			light->type = s->r_u16();
			light->level = s->r_u16();
			s->r_fvector3(light->diffuse);
			s->r_fvector3(light->position);
			s->r_fvector3(light->direction);
			light->range = s->r_float();
			light->range2 = s->r_float();
			light->attenuation0 = s->r_float();
			light->attenuation1 = s->r_float();
			light->attenuation2 = s->r_float();
			light->energy = s->r_float();
			for (uint_fast32_t i = 0; i != 3; ++i)
				s->r_fvector3(light->tri[i]);
			light->unknown = cs ? s->r_u32() : 0;
		}
		r.close_chunk(s);
	}
}